

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerCoerseRegex(Lowerer *this,Instr *instr)

{
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  int iVar5;
  LabelInstr *labelTarget;
  LabelInstr *target;
  Lowerer *baseOpnd;
  undefined4 *puVar6;
  undefined4 extraout_var;
  AddrOpnd *pAVar7;
  IndirOpnd *compareSrc1;
  Lowerer *this_00;
  LowererMD *this_01;
  
  labelTarget = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  baseOpnd = (Lowerer *)IR::Instr::UnlinkSrc1(instr);
  OVar3 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar4 = IR::Opnd::IsNotTaggedValue((Opnd *)baseOpnd);
  if (!bVar4) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,(Opnd *)baseOpnd,instr,labelTarget,false);
  }
  pSVar1 = instr->m_func->m_scriptContextInfo;
  iVar5 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,0x23);
  pAVar7 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar5),AddrOpndKindDynamicVtable,
                             this->m_func,false,(Var)0x0);
  this_00 = baseOpnd;
  compareSrc1 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0,TyUint64,instr->m_func,false);
  InsertCompareBranch(this_00,&compareSrc1->super_Opnd,&pAVar7->super_Opnd,BrNeq_A,false,labelTarget
                      ,instr,false);
  InsertMove(instr->m_dst,(Opnd *)baseOpnd,instr,true);
  InsertBranch(Br,false,target,instr);
  IR::Instr::InsertBefore(instr,&labelTarget->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  LoadScriptContext(this,instr);
  this_01 = &this->m_lowererMD;
  pAVar7 = IR::AddrOpnd::NewNull(instr->m_func);
  LowererMD::LoadHelperArgument(this_01,instr,&pAVar7->super_Opnd);
  LowererMD::LoadHelperArgument(this_01,instr,(Opnd *)baseOpnd);
  LowererMD::ChangeToHelperCall
            (this_01,instr,HelperOp_CoerseRegex,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0
             ,false);
  return;
}

Assistant:

void
Lowerer::LowerCoerseRegex(IR::Instr* instr)
{
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::RegOpnd * src1Opnd = instr->UnlinkSrc1()->AsRegOpnd();
    if (!src1Opnd->IsNotTaggedValue())
    {
        this->m_lowererMD.GenerateObjectTest(src1Opnd, instr, helperLabel);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    InsertCompareBranch(IR::IndirOpnd::New(src1Opnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd, Js::OpCode::BrNeq_A, helperLabel, instr);

    InsertMove(instr->GetDst(), src1Opnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);
    instr->InsertAfter(doneLabel);

    this->LoadScriptContext(instr);
    this->m_lowererMD.LoadHelperArgument(instr, IR::AddrOpnd::NewNull(instr->m_func));   // option
    this->m_lowererMD.LoadHelperArgument(instr, src1Opnd); // regex
    this->m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_CoerseRegex);
}